

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerLockingMode(Pager *pPager,int eMode)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  
  if ((-1 < in_ESI) && (*(char *)(in_RDI + 0x10) == '\0')) {
    iVar1 = sqlite3WalHeapMemory(*(Wal **)(in_RDI + 0x128));
    if (iVar1 == 0) {
      *(char *)(in_RDI + 8) = (char)in_ESI;
    }
  }
  return (int)*(byte *)(in_RDI + 8);
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerLockingMode(Pager *pPager, int eMode){
  assert( eMode==PAGER_LOCKINGMODE_QUERY
            || eMode==PAGER_LOCKINGMODE_NORMAL
            || eMode==PAGER_LOCKINGMODE_EXCLUSIVE );
  assert( PAGER_LOCKINGMODE_QUERY<0 );
  assert( PAGER_LOCKINGMODE_NORMAL>=0 && PAGER_LOCKINGMODE_EXCLUSIVE>=0 );
  assert( pPager->exclusiveMode || 0==sqlite3WalHeapMemory(pPager->pWal) );
  if( eMode>=0 && !pPager->tempFile && !sqlite3WalHeapMemory(pPager->pWal) ){
    pPager->exclusiveMode = (u8)eMode;
  }
  return (int)pPager->exclusiveMode;
}